

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.h
# Opt level: O3

ON_SubDVertex * __thiscall ON_SubDVertexIterator::NextVertex(ON_SubDVertexIterator *this)

{
  ON_SubDEdge *this_00;
  ON_SubDVertex *pOVar1;
  ON_SubDFace *this_01;
  uint uVar2;
  
  uVar2 = this->m_vertex_index + 1;
  this->m_vertex_index = uVar2;
  if (uVar2 < this->m_vertex_count) {
    if ((this->m_component_ptr).m_ptr == 0) {
      if (this->m_v_current == (ON_SubDVertex *)0x0) goto LAB_005aa076;
      pOVar1 = this->m_v_current->m_next_vertex;
    }
    else {
      this_00 = ON_SubDComponentPtr::Edge(&this->m_component_ptr);
      if (this_00 == (ON_SubDEdge *)0x0) {
        this_01 = ON_SubDComponentPtr::Face(&this->m_component_ptr);
        if (this_01 == (ON_SubDFace *)0x0) goto LAB_005aa06e;
        pOVar1 = ON_SubDFace::Vertex(this_01,this->m_vertex_index);
      }
      else {
        pOVar1 = ON_SubDEdge::Vertex(this_00,this->m_vertex_index);
      }
    }
    this->m_v_current = pOVar1;
  }
  else {
    this->m_vertex_index = this->m_vertex_count;
LAB_005aa06e:
    this->m_v_current = (ON_SubDVertex *)0x0;
LAB_005aa076:
    pOVar1 = (ON_SubDVertex *)0x0;
  }
  return pOVar1;
}

Assistant:

const class ON_SubDVertex* NextVertex()
  {
    m_vertex_index++;
    if (m_vertex_index < m_vertex_count)
    {
      if (0 == m_component_ptr.m_ptr)
      {
        if (nullptr != m_v_current)
          m_v_current = m_v_current->m_next_vertex;
      }
      else
      {
        const ON_SubDEdge* edge = m_component_ptr.Edge();
        if (nullptr != edge)
        {
          m_v_current = edge->Vertex(m_vertex_index);
        }
        else
        {
          const ON_SubDFace* face = m_component_ptr.Face();
          if (nullptr != face)
            m_v_current = face->Vertex(m_vertex_index);
          else
            m_v_current = nullptr;
        }
      }
    }
    else
    {
      m_vertex_index = m_vertex_count;
      m_v_current = nullptr;
    }
    return m_v_current;
  }